

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O2

int decode_session_identifier
              (uint64_t *issued_at,ptls_iovec_t *psk,uint32_t *ticket_age_add,
              ptls_iovec_t *server_name,uint16_t *key_exchange_id,uint16_t *csid,
              ptls_iovec_t *negotiated_protocol,uint8_t *src,uint8_t *end)

{
  long *plVar1;
  int iVar2;
  int iVar3;
  byte *pbVar4;
  ulong uVar5;
  byte *end_00;
  ushort *local_40;
  ptls_iovec_t *local_38;
  
  iVar2 = 0x32;
  iVar3 = iVar2;
  if (1 < (ulong)((long)end - (long)src)) {
    uVar5 = (ulong)(ushort)(*(ushort *)src << 8 | *(ushort *)src >> 8);
    plVar1 = (long *)(src + 2);
    if (((uVar5 <= (ulong)((long)end - (long)plVar1)) && (7 < uVar5)) &&
       (*plVar1 == 0x31303030736c7470)) {
      end_00 = (byte *)((long)plVar1 + uVar5);
      local_40 = (ushort *)(src + 10);
      local_38 = server_name;
      iVar3 = ptls_decode64(issued_at,(uint8_t **)&local_40,end_00);
      if ((iVar3 == 0) && (iVar3 = iVar2, 1 < (ulong)((long)end_00 - (long)local_40))) {
        uVar5 = (ulong)(ushort)(*local_40 << 8 | *local_40 >> 8);
        local_40 = local_40 + 1;
        if (uVar5 <= (ulong)((long)end_00 - (long)local_40)) {
          psk->base = (uint8_t *)local_40;
          local_40 = (ushort *)((long)local_40 + uVar5);
          psk->len = uVar5;
          if ((1 < (long)end_00 - (long)local_40) &&
             (*key_exchange_id = *local_40 << 8 | *local_40 >> 8,
             1 < ((long)end_00 - (long)local_40) + -2)) {
            *csid = local_40[1] << 8 | local_40[1] >> 8;
            local_40 = local_40 + 2;
            iVar3 = ptls_decode32(ticket_age_add,(uint8_t **)&local_40,end_00);
            if ((iVar3 == 0) && (iVar3 = iVar2, 1 < (ulong)((long)end_00 - (long)local_40))) {
              uVar5 = (ulong)(ushort)(*local_40 << 8 | *local_40 >> 8);
              local_40 = local_40 + 1;
              if (uVar5 <= (ulong)((long)end_00 - (long)local_40)) {
                local_38->base = (uint8_t *)local_40;
                pbVar4 = (byte *)((long)local_40 + uVar5);
                local_38->len = uVar5;
                if (end_00 != pbVar4) {
                  uVar5 = (ulong)*pbVar4;
                  pbVar4 = pbVar4 + 1;
                  if (uVar5 <= (ulong)((long)end_00 - (long)pbVar4)) {
                    negotiated_protocol->base = pbVar4;
                    negotiated_protocol->len = uVar5;
                    iVar3 = 0x32;
                    if (pbVar4 + uVar5 == end && end_00 == pbVar4 + uVar5) {
                      iVar3 = 0;
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return iVar3;
}

Assistant:

int decode_session_identifier(uint64_t *issued_at, ptls_iovec_t *psk, uint32_t *ticket_age_add, ptls_iovec_t *server_name,
                              uint16_t *key_exchange_id, uint16_t *csid, ptls_iovec_t *negotiated_protocol, const uint8_t *src,
                              const uint8_t *const end)
{
    int ret = 0;

    ptls_decode_block(src, end, 2, {
        if (end - src < SESSION_IDENTIFIER_MAGIC_SIZE ||
            memcmp(src, SESSION_IDENTIFIER_MAGIC, SESSION_IDENTIFIER_MAGIC_SIZE) != 0) {
            ret = PTLS_ALERT_DECODE_ERROR;
            goto Exit;
        }
        src += SESSION_IDENTIFIER_MAGIC_SIZE;
        if ((ret = ptls_decode64(issued_at, &src, end)) != 0)
            goto Exit;
        ptls_decode_open_block(src, end, 2, {
            *psk = ptls_iovec_init(src, end - src);
            src = end;
        });
        if ((ret = ptls_decode16(key_exchange_id, &src, end)) != 0)
            goto Exit;
        if ((ret = ptls_decode16(csid, &src, end)) != 0)
            goto Exit;
        if ((ret = ptls_decode32(ticket_age_add, &src, end)) != 0)
            goto Exit;
        ptls_decode_open_block(src, end, 2, {
            *server_name = ptls_iovec_init(src, end - src);
            src = end;
        });
        ptls_decode_open_block(src, end, 1, {
            *negotiated_protocol = ptls_iovec_init(src, end - src);
            src = end;
        });
    });

Exit:
    return ret;
}